

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_self_test(int verbose)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uchar (*pauVar4) [16];
  uchar (*pauVar5) [32];
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uchar *puVar10;
  uchar (*pauVar11) [48];
  ulong uVar12;
  uint uVar13;
  size_t __n;
  uchar (*pauVar14) [32];
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  size_t offset;
  uchar buf [64];
  uchar iv [16];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  mbedtls_aes_xts_context ctx_xts;
  uchar tmp [16];
  size_t local_460;
  undefined1 local_458 [16];
  ulong local_448;
  ulong uStack_440;
  uchar local_438 [32];
  uchar local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  uchar (*local_3e0) [16];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  uchar local_3b8 [16];
  mbedtls_aes_context local_3a8;
  mbedtls_aes_xts_context local_288;
  
  local_418[0] = '\0';
  local_418[1] = '\0';
  local_418[2] = '\0';
  local_418[3] = '\0';
  local_418[4] = '\0';
  local_418[5] = '\0';
  local_418[6] = '\0';
  local_418[7] = '\0';
  local_418[8] = '\0';
  local_418[9] = '\0';
  local_418[10] = '\0';
  local_418[0xb] = '\0';
  local_418[0xc] = '\0';
  local_418[0xd] = '\0';
  local_418[0xe] = '\0';
  local_418[0xf] = '\0';
  local_408 = (undefined1  [16])0x0;
  memset(&local_3a8,0,0x120);
  uVar15 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar9 = (uVar15 >> 1) * 0x40 + 0x80;
        uVar13 = uVar15 & 1;
        if (verbose != 0) {
          pcVar7 = "enc";
          if (uVar13 == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-ECB-%3d (%s): ",(ulong)uVar9,pcVar7);
        }
        local_458 = (undefined1  [16])0x0;
        if (uVar13 == 0) {
          iVar1 = mbedtls_aes_setkey_dec(&local_3a8,local_418,uVar9);
          pauVar4 = aes_test_ecb_dec;
        }
        else {
          iVar1 = mbedtls_aes_setkey_enc(&local_3a8,local_418,uVar9);
          pauVar4 = aes_test_ecb_enc;
        }
        if (uVar9 != 0xc0 || iVar1 != -0x72) break;
        puts("skipped");
        uVar15 = uVar15 + 1;
        if (uVar15 == 6) {
          if (verbose == 0) goto LAB_0010de55;
          goto LAB_0010de4b;
        }
      }
      if (iVar1 != 0) goto LAB_0010e6a6;
      local_3e0 = pauVar4 + (uVar15 >> 1);
      iVar2 = 10000;
      do {
        iVar1 = mbedtls_aes_crypt_ecb(&local_3a8,uVar13,local_458,local_458);
        if (iVar1 != 0) goto LAB_0010e6a6;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      auVar18[0] = -((*local_3e0)[0] == local_458[0]);
      auVar18[1] = -((*local_3e0)[1] == local_458[1]);
      auVar18[2] = -((*local_3e0)[2] == local_458[2]);
      auVar18[3] = -((*local_3e0)[3] == local_458[3]);
      auVar18[4] = -((*local_3e0)[4] == local_458[4]);
      auVar18[5] = -((*local_3e0)[5] == local_458[5]);
      auVar18[6] = -((*local_3e0)[6] == local_458[6]);
      auVar18[7] = -((*local_3e0)[7] == local_458[7]);
      auVar18[8] = -((*local_3e0)[8] == local_458[8]);
      auVar18[9] = -((*local_3e0)[9] == local_458[9]);
      auVar18[10] = -((*local_3e0)[10] == local_458[10]);
      auVar18[0xb] = -((*local_3e0)[0xb] == local_458[0xb]);
      auVar18[0xc] = -((*local_3e0)[0xc] == local_458[0xc]);
      auVar18[0xd] = -((*local_3e0)[0xd] == local_458[0xd]);
      auVar18[0xe] = -((*local_3e0)[0xe] == local_458[0xe]);
      auVar18[0xf] = -((*local_3e0)[0xf] == local_458[0xf]);
      if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010e380;
      if (verbose != 0) break;
      uVar15 = uVar15 + 1;
      if (uVar15 == 6) goto LAB_0010de55;
    }
    puts("passed");
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
LAB_0010de4b:
  putchar(10);
LAB_0010de55:
  uVar15 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar9 = (uVar15 >> 1) * 0x40 + 0x80;
        if (verbose != 0) {
          pcVar7 = "enc";
          if ((uVar15 & 1) == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-CBC-%3d (%s): ",(ulong)uVar9,pcVar7);
        }
        local_3f8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        if ((uVar15 & 1) == 0) {
          iVar1 = mbedtls_aes_setkey_dec(&local_3a8,local_418,uVar9);
          pauVar4 = aes_test_cbc_dec;
        }
        else {
          iVar1 = mbedtls_aes_setkey_enc(&local_3a8,local_418,uVar9);
          pauVar4 = aes_test_cbc_enc;
        }
        if (uVar9 != 0xc0 || iVar1 != -0x72) break;
        puts("skipped");
        uVar15 = uVar15 + 1;
        if (uVar15 == 6) {
          if (verbose == 0) goto LAB_0010dfdb;
          goto LAB_0010dfd1;
        }
      }
      if (iVar1 != 0) goto LAB_0010e6a6;
      pauVar4 = pauVar4 + (uVar15 >> 1);
      iVar2 = 10000;
      do {
        auVar18 = local_3d8;
        bVar17 = (uVar15 & 1) != 0;
        if (bVar17) {
          local_3d8 = local_458;
          local_458 = auVar18;
        }
        iVar1 = mbedtls_aes_crypt_cbc(&local_3a8,(uint)bVar17,0x10,local_3f8,local_458,local_458);
        if (iVar1 != 0) goto LAB_0010e6a6;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      auVar19[0] = -((*pauVar4)[0] == local_458[0]);
      auVar19[1] = -((*pauVar4)[1] == local_458[1]);
      auVar19[2] = -((*pauVar4)[2] == local_458[2]);
      auVar19[3] = -((*pauVar4)[3] == local_458[3]);
      auVar19[4] = -((*pauVar4)[4] == local_458[4]);
      auVar19[5] = -((*pauVar4)[5] == local_458[5]);
      auVar19[6] = -((*pauVar4)[6] == local_458[6]);
      auVar19[7] = -((*pauVar4)[7] == local_458[7]);
      auVar19[8] = -((*pauVar4)[8] == local_458[8]);
      auVar19[9] = -((*pauVar4)[9] == local_458[9]);
      auVar19[10] = -((*pauVar4)[10] == local_458[10]);
      auVar19[0xb] = -((*pauVar4)[0xb] == local_458[0xb]);
      auVar19[0xc] = -((*pauVar4)[0xc] == local_458[0xc]);
      auVar19[0xd] = -((*pauVar4)[0xd] == local_458[0xd]);
      auVar19[0xe] = -((*pauVar4)[0xe] == local_458[0xe]);
      auVar19[0xf] = -((*pauVar4)[0xf] == local_458[0xf]);
      if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010e380;
      if (verbose != 0) break;
      uVar15 = uVar15 + 1;
      if (uVar15 == 6) goto LAB_0010dfdb;
    }
    puts("passed");
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
LAB_0010dfd1:
  putchar(10);
LAB_0010dfdb:
  uVar15 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar9 = uVar15 >> 1;
        uVar13 = uVar9 * 0x40 + 0x80;
        if (verbose != 0) {
          pcVar7 = "enc";
          if ((uVar15 & 1) == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-CFB128-%3d (%s): ",(ulong)uVar13,pcVar7);
        }
        local_3f8[8] = '\b';
        local_3f8[9] = '\t';
        local_3f8[10] = '\n';
        local_3f8[0xb] = '\v';
        local_3f8[0xc] = '\f';
        local_3f8[0xd] = '\r';
        local_3f8[0xe] = '\x0e';
        local_3f8[0xf] = '\x0f';
        local_3f8[0] = '\0';
        local_3f8[1] = '\x01';
        local_3f8[2] = '\x02';
        local_3f8[3] = '\x03';
        local_3f8[4] = '\x04';
        local_3f8[5] = '\x05';
        local_3f8[6] = '\x06';
        local_3f8[7] = '\a';
        memcpy(local_418,aes_test_cfb128_key + uVar9,(ulong)(uVar13 >> 3));
        local_460 = 0;
        iVar1 = mbedtls_aes_setkey_enc(&local_3a8,local_418,uVar13);
        if (uVar13 != 0xc0 || iVar1 != -0x72) break;
        puts("skipped");
        uVar15 = uVar15 + 1;
        if (uVar15 == 6) {
          if (verbose == 0) goto LAB_0010e1bd;
          goto LAB_0010e1b3;
        }
      }
      if (iVar1 != 0) goto LAB_0010e6a6;
      bVar17 = (uVar15 & 1) != 0;
      if (bVar17) {
        local_438[0x10] = 0xf6;
        local_438[0x11] = 0x9f;
        local_438[0x12] = '$';
        local_438[0x13] = 'E';
        local_438[0x14] = 0xdf;
        local_438[0x15] = 'O';
        local_438[0x16] = 0x9b;
        local_438[0x17] = '\x17';
        local_438[0x18] = 0xad;
        local_438[0x19] = '+';
        local_438[0x1a] = 'A';
        local_438[0x1b] = '{';
        local_438[0x1c] = 0xe6;
        local_438[0x1d] = 'l';
        local_438[0x1e] = '7';
        local_438[0x1f] = '\x10';
        local_438[0] = '0';
        local_438[1] = 200;
        local_438[2] = '\x1c';
        local_438[3] = 'F';
        local_438[4] = 0xa3;
        local_438[5] = '\\';
        local_438[6] = 0xe4;
        local_438[7] = '\x11';
        local_438[8] = 0xe5;
        local_438[9] = 0xfb;
        local_438[10] = 0xc1;
        local_438[0xb] = '\x19';
        local_438[0xc] = '\x1a';
        local_438[0xd] = '\n';
        local_438[0xe] = 'R';
        local_438[0xf] = 0xef;
        local_448._0_1_ = 0xae;
        local_448._1_1_ = '-';
        local_448._2_1_ = 0x8a;
        local_448._3_1_ = 'W';
        local_448._4_1_ = '\x1e';
        local_448._5_1_ = '\x03';
        local_448._6_1_ = 0xac;
        local_448._7_1_ = 0x9c;
        uStack_440._0_1_ = 0x9e;
        uStack_440._1_1_ = 0xb7;
        uStack_440._2_1_ = 'o';
        uStack_440._3_1_ = 0xac;
        uStack_440._4_1_ = 'E';
        uStack_440._5_1_ = 0xaf;
        uStack_440._6_1_ = 0x8e;
        uStack_440._7_1_ = 'Q';
        local_458[8] = 0xe9;
        local_458[9] = '=';
        local_458[10] = '~';
        local_458[0xb] = '\x11';
        local_458[0xc] = 's';
        local_458[0xd] = 0x93;
        local_458[0xe] = '\x17';
        local_458[0xf] = '*';
        local_458[0] = 'k';
        local_458[1] = 0xc1;
        local_458[2] = 0xbe;
        local_458[3] = 0xe2;
        local_458[4] = '.';
        local_458[5] = '@';
        local_458[6] = 0x9f;
        local_458[7] = 0x96;
        puVar10 = aes_test_cfb128_ct[uVar9];
      }
      else {
        local_458 = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar9];
        local_448 = *(ulong *)(aes_test_cfb128_ct[uVar9] + 0x10);
        uStack_440 = *(ulong *)(aes_test_cfb128_ct[uVar9] + 0x18);
        local_438._0_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x20);
        local_438._8_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x28);
        local_438._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x30);
        local_438._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x38);
        puVar10 = aes_test_cfb128_pt;
      }
      iVar1 = mbedtls_aes_crypt_cfb128
                        (&local_3a8,(uint)bVar17,0x40,&local_460,local_3f8,local_458,local_458);
      if (iVar1 != 0) goto LAB_0010e6a6;
      iVar1 = bcmp(local_458,puVar10,0x40);
      if (iVar1 != 0) goto LAB_0010e380;
      if (verbose != 0) break;
      uVar15 = uVar15 + 1;
      if (uVar15 == 6) goto LAB_0010e1bd;
    }
    puts("passed");
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
LAB_0010e1b3:
  putchar(10);
LAB_0010e1bd:
  uVar15 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar9 = uVar15 >> 1;
        uVar13 = uVar9 * 0x40 + 0x80;
        if (verbose != 0) {
          pcVar7 = "enc";
          if ((uVar15 & 1) == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-OFB-%3d (%s): ",(ulong)uVar13,pcVar7);
        }
        local_3f8[8] = '\b';
        local_3f8[9] = '\t';
        local_3f8[10] = '\n';
        local_3f8[0xb] = '\v';
        local_3f8[0xc] = '\f';
        local_3f8[0xd] = '\r';
        local_3f8[0xe] = '\x0e';
        local_3f8[0xf] = '\x0f';
        local_3f8[0] = '\0';
        local_3f8[1] = '\x01';
        local_3f8[2] = '\x02';
        local_3f8[3] = '\x03';
        local_3f8[4] = '\x04';
        local_3f8[5] = '\x05';
        local_3f8[6] = '\x06';
        local_3f8[7] = '\a';
        memcpy(local_418,aes_test_cfb128_key + uVar9,(ulong)(uVar13 >> 3));
        local_460 = 0;
        iVar1 = mbedtls_aes_setkey_enc(&local_3a8,local_418,uVar13);
        if (uVar13 != 0xc0 || iVar1 != -0x72) break;
        puts("skipped");
        uVar15 = uVar15 + 1;
        if (uVar15 == 6) {
          if (verbose == 0) goto LAB_0010e39b;
          goto LAB_0010e391;
        }
      }
      if (iVar1 != 0) goto LAB_0010e6a6;
      if ((uVar15 & 1) == 0) {
        local_458 = *(undefined1 (*) [16])aes_test_ofb_ct[uVar9];
        local_448 = *(ulong *)(aes_test_ofb_ct[uVar9] + 0x10);
        uStack_440 = *(ulong *)(aes_test_ofb_ct[uVar9] + 0x18);
        local_438._0_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar9] + 0x20);
        local_438._8_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar9] + 0x28);
        local_438._16_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar9] + 0x30);
        local_438._24_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar9] + 0x38);
        puVar10 = aes_test_ofb_pt;
      }
      else {
        local_438[0x10] = 0xf6;
        local_438[0x11] = 0x9f;
        local_438[0x12] = '$';
        local_438[0x13] = 'E';
        local_438[0x14] = 0xdf;
        local_438[0x15] = 'O';
        local_438[0x16] = 0x9b;
        local_438[0x17] = '\x17';
        local_438[0x18] = 0xad;
        local_438[0x19] = '+';
        local_438[0x1a] = 'A';
        local_438[0x1b] = '{';
        local_438[0x1c] = 0xe6;
        local_438[0x1d] = 'l';
        local_438[0x1e] = '7';
        local_438[0x1f] = '\x10';
        local_438[0] = '0';
        local_438[1] = 200;
        local_438[2] = '\x1c';
        local_438[3] = 'F';
        local_438[4] = 0xa3;
        local_438[5] = '\\';
        local_438[6] = 0xe4;
        local_438[7] = '\x11';
        local_438[8] = 0xe5;
        local_438[9] = 0xfb;
        local_438[10] = 0xc1;
        local_438[0xb] = '\x19';
        local_438[0xc] = '\x1a';
        local_438[0xd] = '\n';
        local_438[0xe] = 'R';
        local_438[0xf] = 0xef;
        local_448._0_1_ = 0xae;
        local_448._1_1_ = '-';
        local_448._2_1_ = 0x8a;
        local_448._3_1_ = 'W';
        local_448._4_1_ = '\x1e';
        local_448._5_1_ = '\x03';
        local_448._6_1_ = 0xac;
        local_448._7_1_ = 0x9c;
        uStack_440._0_1_ = 0x9e;
        uStack_440._1_1_ = 0xb7;
        uStack_440._2_1_ = 'o';
        uStack_440._3_1_ = 0xac;
        uStack_440._4_1_ = 'E';
        uStack_440._5_1_ = 0xaf;
        uStack_440._6_1_ = 0x8e;
        uStack_440._7_1_ = 'Q';
        local_458[8] = 0xe9;
        local_458[9] = '=';
        local_458[10] = '~';
        local_458[0xb] = '\x11';
        local_458[0xc] = 's';
        local_458[0xd] = 0x93;
        local_458[0xe] = '\x17';
        local_458[0xf] = '*';
        local_458[0] = 'k';
        local_458[1] = 0xc1;
        local_458[2] = 0xbe;
        local_458[3] = 0xe2;
        local_458[4] = '.';
        local_458[5] = '@';
        local_458[6] = 0x9f;
        local_458[7] = 0x96;
        puVar10 = aes_test_ofb_ct[uVar9];
      }
      iVar1 = mbedtls_aes_crypt_ofb(&local_3a8,0x40,&local_460,local_3f8,local_458,local_458);
      if (iVar1 != 0) goto LAB_0010e6a6;
      iVar1 = bcmp(local_458,puVar10,0x40);
      if (iVar1 != 0) goto LAB_0010e380;
      if (verbose != 0) break;
      uVar15 = uVar15 + 1;
      if (uVar15 == 6) goto LAB_0010e39b;
    }
    puts("passed");
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
LAB_0010e391:
  putchar(10);
LAB_0010e39b:
  uVar16 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        pcVar7 = "enc";
        if ((uVar16 & 1) == 0) {
          pcVar7 = "dec";
        }
        printf("  AES-CTR-128 (%s): ",pcVar7);
      }
      uVar3 = uVar16 >> 1;
      local_3c8 = *(undefined8 *)aes_test_ctr_nonce_counter[uVar3];
      uStack_3c0 = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar3] + 8);
      local_418 = aes_test_ctr_key[uVar3];
      local_460 = 0;
      iVar1 = mbedtls_aes_setkey_enc(&local_3a8,local_418,0x80);
      if (iVar1 != 0) goto LAB_0010e6a6;
      pauVar11 = aes_test_ctr_pt;
      if ((uVar16 & 1) == 0) {
        pauVar11 = aes_test_ctr_ct;
      }
      __n = (size_t)aes_test_ctr_len[uVar3];
      memcpy(local_458,pauVar11 + uVar3,__n);
      iVar1 = mbedtls_aes_crypt_ctr
                        (&local_3a8,__n,&local_460,(uchar *)&local_3c8,local_3b8,local_458,local_458
                        );
      if (iVar1 != 0) goto LAB_0010e6a6;
      pauVar11 = aes_test_ctr_ct;
      if ((uVar16 & 1) == 0) {
        pauVar11 = aes_test_ctr_pt;
      }
      iVar2 = bcmp(local_458,pauVar11 + uVar3,__n);
      iVar1 = 1;
      if (iVar2 != 0) goto LAB_0010e6a6;
      if (verbose == 0) break;
      puts("passed");
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
      if (uVar15 == 6) {
        putchar(10);
        goto LAB_0010e522;
      }
    }
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 6);
LAB_0010e522:
  memset(&local_288,0,0x240);
  uVar16 = 0;
  do {
    if (verbose != 0) {
      pcVar7 = "enc";
      if ((uVar16 & 1) == 0) {
        pcVar7 = "dec";
      }
      printf("  AES-XTS-128 (%s): ",pcVar7);
    }
    uVar3 = uVar16 >> 1;
    local_418 = *(uchar (*) [16])aes_test_xts_key[uVar3];
    local_408 = *(undefined1 (*) [16])(aes_test_xts_key[uVar3] + 0x10);
    bVar17 = (uVar16 & 1) != 0;
    if (bVar17) {
      iVar1 = mbedtls_aes_xts_setkey_enc(&local_288,local_418,0x100);
      pauVar5 = aes_test_xts_pt32;
      pauVar14 = aes_test_xts_ct32;
    }
    else {
      iVar1 = mbedtls_aes_xts_setkey_dec(&local_288,local_418,0x100);
      pauVar5 = aes_test_xts_ct32;
      pauVar14 = aes_test_xts_pt32;
    }
    if (iVar1 != 0) goto LAB_0010e6a6;
    local_458 = *(undefined1 (*) [16])pauVar5[uVar3];
    local_448 = *(ulong *)(pauVar5[uVar3] + 0x10);
    uStack_440 = *(ulong *)(pauVar5[uVar3] + 0x10 + 8);
    iVar1 = mbedtls_aes_crypt_xts
                      (&local_288,(uint)bVar17,0x20,aes_test_xts_data_unit[uVar3],local_458,
                       local_458);
    if (iVar1 != 0) goto LAB_0010e6a6;
    uVar8 = local_458._0_8_ ^ *(ulong *)pauVar14[uVar3];
    uVar12 = local_458._8_8_ ^ *(ulong *)(pauVar14[uVar3] + 8);
    uVar6 = local_448 ^ *(ulong *)(pauVar14[uVar3] + 0x10);
    uVar3 = uStack_440 ^ *(ulong *)(pauVar14[uVar3] + 0x18);
    if ((verbose == 0) || ((uVar6 != 0 || uVar8 != 0) || (uVar3 != 0 || uVar12 != 0))) {
      iVar1 = 1;
      if ((uVar6 != 0 || uVar8 != 0) || (uVar3 != 0 || uVar12 != 0)) goto LAB_0010e6a6;
    }
    else {
      puts("passed");
    }
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  mbedtls_aes_xts_free(&local_288);
  iVar1 = 0;
LAB_0010e6b9:
  mbedtls_platform_zeroize(&local_3a8,0x120);
  return iVar1;
LAB_0010e380:
  iVar1 = 1;
LAB_0010e6a6:
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_0010e6b9;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB) || \
    defined(MBEDTLS_CIPHER_MODE_OFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_XTS)
    int len;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    /*
     * OFB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-OFB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_ofb_iv, 16 );
        memcpy( key, aes_test_ofb_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ofb_ct[u], 64 );
            aes_tests = aes_test_ofb_pt;
        }
        else
        {
            memcpy( buf, aes_test_ofb_pt, 64 );
            aes_tests = aes_test_ofb_ct[u];
        }

        ret = mbedtls_aes_crypt_ofb( &ctx, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    {
    static const int num_tests =
        sizeof(aes_test_xts_key) / sizeof(*aes_test_xts_key);
    mbedtls_aes_xts_context ctx_xts;

    /*
     * XTS mode
     */
    mbedtls_aes_xts_init( &ctx_xts );

    for( i = 0; i < num_tests << 1; i++ )
    {
        const unsigned char *data_unit;
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-XTS-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( key, 0, sizeof( key ) );
        memcpy( key, aes_test_xts_key[u], 32 );
        data_unit = aes_test_xts_data_unit[u];

        len = sizeof( *aes_test_xts_ct32 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_xts_setkey_dec( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_ct32[u], len );
            aes_tests = aes_test_xts_pt32[u];
        }
        else
        {
            ret = mbedtls_aes_xts_setkey_enc( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_pt32[u], len );
            aes_tests = aes_test_xts_ct32[u];
        }


        ret = mbedtls_aes_crypt_xts( &ctx_xts, mode, len, data_unit,
                                     buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    mbedtls_aes_xts_free( &ctx_xts );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}